

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O1

char * MyGame_Example_Stat_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  short sVar1;
  int iVar2;
  flatcc_builder_ref_t fVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong *puVar6;
  short *psVar7;
  flatcc_builder_ref_t *pfVar8;
  char *pcVar9;
  ulong uVar10;
  ulong *puVar11;
  bool bVar12;
  int more;
  uint16_t val;
  int64_t val_1;
  uint64_t value;
  flatcc_builder_ref_t ref;
  int local_58;
  uint local_54;
  ulong local_50;
  uint64_t local_48;
  flatcc_builder_ref_t local_3c;
  flatcc_builder_ref_t *local_38;
  
  *result = 0;
  iVar2 = flatcc_builder_start_table(ctx->ctx,3);
  if (iVar2 != 0) goto LAB_00111c61;
  local_38 = result;
  if ((buf == end) || (*buf != '{')) {
    local_58 = 0;
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
  }
  else {
    puVar11 = (ulong *)(buf + 1);
    if ((long)end - (long)puVar11 < 2) {
LAB_001115f3:
      puVar11 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar11,end);
    }
    else if ((char)(byte)*puVar11 < '!') {
      if (((byte)*puVar11 != 0x20) || (buf[2] < '!')) goto LAB_001115f3;
      puVar11 = (ulong *)(buf + 2);
    }
    if ((puVar11 == (ulong *)end) || ((byte)*puVar11 != 0x7d)) {
      local_58 = 1;
      buf = (char *)puVar11;
    }
    else {
      local_58 = 0;
      buf = (char *)((long)puVar11 + 1);
      if ((long)end - (long)buf < 2) {
LAB_00111caf:
        buf = flatcc_json_parser_space_ext(ctx,buf,end);
      }
      else if (*buf < '!') {
        if ((*buf != 0x20) || ((char)*(byte *)((long)puVar11 + 2) < '!')) goto LAB_00111caf;
        buf = (char *)((long)puVar11 + 2);
      }
    }
  }
  while (local_58 != 0) {
    if (buf != end) {
      if ((byte)*(ulong *)buf == 0x22) {
        buf = (char *)((long)buf + 1);
      }
      else {
        buf = flatcc_json_parser_set_error(ctx,buf,end,5);
      }
    }
    uVar10 = (long)end - (long)buf;
    if (uVar10 < 8) {
      uVar4 = 0;
      switch(uVar10) {
      case 7:
        uVar4 = (long)(char)*(byte *)((long)buf + 6) << 8;
      case 6:
        uVar4 = uVar4 | (long)(char)*(byte *)((long)buf + 5) << 0x10;
      case 5:
        uVar4 = uVar4 | (long)(char)*(byte *)((long)buf + 4) << 0x18;
      case 4:
        uVar4 = uVar4 | (long)(char)*(byte *)((long)buf + 3) << 0x20;
      case 3:
        uVar4 = uVar4 | (long)(char)*(byte *)((long)buf + 2) << 0x28;
      case 2:
        uVar4 = uVar4 | (long)(char)*(byte *)((long)buf + 1) << 0x30;
      case 1:
        uVar4 = uVar4 | (ulong)(byte)*(ulong *)buf << 0x38;
      }
    }
    else {
      uVar4 = *(ulong *)buf;
      uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
              | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18
              | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    }
    puVar11 = (ulong *)buf;
    if (uVar4 < 0x6964000000000000) {
      if ((uVar4 & 0x7fffffffff000000) == 0x636f756e74000000) {
        if ((5 < (long)uVar10) && (*(byte *)((long)buf + 5) == 0x22)) {
          pbVar5 = (byte *)((long)buf + 6);
          if ((long)end - (long)pbVar5 < 2) {
LAB_00111856:
            pbVar5 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar5,end);
          }
          else if ((char)*pbVar5 < '!') {
            if ((*pbVar5 != 0x20) || ((char)*(byte *)((long)buf + 7) < '!')) goto LAB_00111856;
            pbVar5 = (byte *)((long)buf + 7);
          }
          if ((pbVar5 == (byte *)end) || (*pbVar5 != 0x3a)) {
            puVar11 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar5,end,4);
          }
          else {
            puVar11 = (ulong *)(pbVar5 + 1);
            if ((long)end - (long)puVar11 < 2) {
LAB_00111994:
              puVar11 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar11,end);
            }
            else if ((char)(byte)*puVar11 < '!') {
              if (((byte)*puVar11 != 0x20) || ((char)pbVar5[2] < '!')) goto LAB_00111994;
              puVar11 = (ulong *)(pbVar5 + 2);
            }
          }
        }
        if ((ulong *)buf == puVar11) {
LAB_00111b31:
          buf = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar11,end);
        }
        else {
          local_54 = local_54 & 0xffff0000;
          local_48 = 0;
          local_50 = local_50 & 0xffffffff00000000;
          puVar6 = puVar11;
          if ((puVar11 != (ulong *)end) &&
             (puVar6 = (ulong *)flatcc_json_parser_integer
                                          (ctx,(char *)puVar11,end,(int *)&local_50,&local_48),
             puVar6 != puVar11)) {
            if ((int)local_50 == 0) {
              if (local_48 < 0x10000) {
                local_54 = CONCAT22(local_54._2_2_,(short)local_48);
                goto LAB_00111a2c;
              }
              iVar2 = 7;
            }
            else {
              iVar2 = 8;
            }
            puVar6 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar6,end,iVar2);
          }
LAB_00111a2c:
          buf = (char *)puVar6;
          if ((puVar11 == puVar6) &&
             (buf = flatcc_json_parser_symbolic_uint16
                              (ctx,(char *)puVar6,end,
                               MyGame_Example_Stat_parse_json_table::symbolic_parsers,
                               (uint16_t *)&local_54), buf == end || (ulong *)buf == puVar6)) {
LAB_00111bdc:
            bVar12 = false;
          }
          else {
            sVar1 = (short)local_54;
            if (((short)local_54 != 0) || (bVar12 = true, (ctx->flags & 2) != 0)) {
              psVar7 = (short *)flatcc_builder_table_add(ctx->ctx,2,2,2);
              if (psVar7 == (short *)0x0) goto LAB_00111bdc;
              *psVar7 = sVar1;
LAB_00111bd8:
              bVar12 = true;
            }
          }
LAB_00111bde:
          if (!bVar12) goto LAB_00111c61;
        }
      }
      else {
LAB_00111846:
        buf = flatcc_json_parser_unmatched_symbol(ctx,buf,end);
      }
    }
    else {
      if ((uint)(uVar4 >> 0x28) == 0x76616c) {
        if ((3 < (long)uVar10) && (*(byte *)((long)buf + 3) == 0x22)) {
          pbVar5 = (byte *)((long)buf + 4);
          if ((long)end - (long)pbVar5 < 2) {
LAB_001118b1:
            pbVar5 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar5,end);
          }
          else if ((char)*pbVar5 < '!') {
            if ((*pbVar5 != 0x20) || ((char)*(byte *)((long)buf + 5) < '!')) goto LAB_001118b1;
            pbVar5 = (byte *)((long)buf + 5);
          }
          if ((pbVar5 == (byte *)end) || (*pbVar5 != 0x3a)) {
            puVar11 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar5,end,4);
          }
          else {
            puVar11 = (ulong *)(pbVar5 + 1);
            if ((long)end - (long)puVar11 < 2) {
LAB_00111aa9:
              puVar11 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar11,end);
            }
            else if ((char)(byte)*puVar11 < '!') {
              if (((byte)*puVar11 != 0x20) || ((char)pbVar5[2] < '!')) goto LAB_00111aa9;
              puVar11 = (ulong *)(pbVar5 + 2);
            }
          }
        }
        if ((ulong *)buf == puVar11) goto LAB_00111b31;
        local_50 = 0;
        local_48 = 0;
        local_54 = 0;
        puVar6 = puVar11;
        uVar10 = local_50;
        if ((puVar11 != (ulong *)end) &&
           (puVar6 = (ulong *)flatcc_json_parser_integer
                                        (ctx,(char *)puVar11,end,(int *)&local_54,&local_48),
           uVar10 = local_50, puVar6 != puVar11)) {
          if (local_54 == 0) {
            uVar10 = local_48;
            if ((long)local_48 < 0) {
              iVar2 = 7;
              goto LAB_00111b5d;
            }
          }
          else if (local_48 < 0x8000000000000001) {
            uVar10 = -local_48;
          }
          else {
            iVar2 = 8;
LAB_00111b5d:
            puVar6 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar6,end,iVar2);
            uVar10 = local_50;
          }
        }
        local_50 = uVar10;
        buf = (char *)puVar6;
        if ((puVar11 != puVar6) ||
           (buf = flatcc_json_parser_symbolic_int64
                            (ctx,(char *)puVar6,end,
                             MyGame_Example_Stat_parse_json_table::symbolic_parsers_1,
                             (int64_t *)&local_50), buf != end && (ulong *)buf != puVar6)) {
          uVar10 = local_50;
          if ((local_50 == 0) && (bVar12 = true, (ctx->flags & 2) == 0)) goto LAB_00111bde;
          puVar11 = (ulong *)flatcc_builder_table_add(ctx->ctx,1,8,8);
          if (puVar11 != (ulong *)0x0) {
            *puVar11 = uVar10;
            goto LAB_00111bd8;
          }
        }
        goto LAB_00111bdc;
      }
      if ((uVar4 & 0xffff000000000000) != 0x6964000000000000) goto LAB_00111846;
      if ((2 < (long)uVar10) && (*(byte *)((long)buf + 2) == 0x22)) {
        pbVar5 = (byte *)((long)buf + 3);
        if ((long)end - (long)pbVar5 < 2) {
LAB_0011192e:
          pbVar5 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar5,end);
        }
        else if ((char)*pbVar5 < '!') {
          if ((*pbVar5 != 0x20) || ((char)*(byte *)((long)buf + 4) < '!')) goto LAB_0011192e;
          pbVar5 = (byte *)((long)buf + 4);
        }
        if ((pbVar5 == (byte *)end) || (*pbVar5 != 0x3a)) {
          puVar11 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar5,end,4);
        }
        else {
          puVar11 = (ulong *)(pbVar5 + 1);
          if ((long)end - (long)puVar11 < 2) {
LAB_00111c0f:
            puVar11 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar11,end);
          }
          else if ((char)(byte)*puVar11 < '!') {
            if (((byte)*puVar11 != 0x20) || ((char)pbVar5[2] < '!')) goto LAB_00111c0f;
            puVar11 = (ulong *)(pbVar5 + 2);
          }
        }
      }
      bVar12 = (ulong *)buf == puVar11;
      buf = (char *)puVar11;
      if (bVar12) goto LAB_00111846;
      buf = flatcc_json_parser_build_string(ctx,(char *)puVar11,end,&local_3c);
      if ((local_3c == 0) ||
         (pfVar8 = flatcc_builder_table_add_offset(ctx->ctx,0),
         pfVar8 == (flatcc_builder_ref_t *)0x0)) goto LAB_00111c61;
      *pfVar8 = local_3c;
    }
    buf = flatcc_json_parser_object_end(ctx,buf,end,&local_58);
  }
  if (ctx->error == 0) {
    fVar3 = flatcc_builder_end_table(ctx->ctx);
    *local_38 = fVar3;
    if (fVar3 != 0) {
      return (char *)(ulong *)buf;
    }
  }
LAB_00111c61:
  pcVar9 = flatcc_json_parser_set_error(ctx,buf,end,0x23);
  return pcVar9;
}

Assistant:

static const char *MyGame_Example_Stat_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    const char *mark;
    uint64_t w;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 3)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x6964000000000000) { /* branch "id" */
            if ((w & 0xffffffffff000000) == 0x636f756e74000000) { /* "count" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                if (mark != buf) {
                    uint16_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            monster_test_local_MyGame_Example_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    buf = flatcc_json_parser_uint16(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_uint16(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    if (val != UINT16_C(0) || (ctx->flags & flatcc_json_parser_f_force_add)) {
                        if (!(pval = flatcc_builder_table_add(ctx->ctx, 2, 2, 2))) goto failed;
                        flatbuffers_uint16_write_to_pe(pval, val);
                    }
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "count" */
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            } /* "count" */
        } else { /* branch "id" */
            if ((w & 0xffffff0000000000) == 0x76616c0000000000) { /* "val" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                if (mark != buf) {
                    int64_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            monster_test_local_MyGame_Example_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    buf = flatcc_json_parser_int64(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_int64(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    if (val != INT64_C(0) || (ctx->flags & flatcc_json_parser_f_force_add)) {
                        if (!(pval = flatcc_builder_table_add(ctx->ctx, 1, 8, 8))) goto failed;
                        flatbuffers_int64_write_to_pe(pval, val);
                    }
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "val" */
                if ((w & 0xffff000000000000) == 0x6964000000000000) { /* "id" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                    if (mark != buf) {
                        buf = flatcc_json_parser_build_string(ctx, buf, end, &ref);
                        if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 0))) goto failed;
                        *pref = ref;
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "id" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* "id" */
            } /* "val" */
        } /* branch "id" */
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}